

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O0

FormulaList * __thiscall FOOLElimination::process(FOOLElimination *this,FormulaList *formulas)

{
  bool bVar1;
  Formula *head;
  List<Kernel::Formula_*> *this_00;
  List<Kernel::Formula_*> *tail;
  List<Kernel::Formula_*> *in_RSI;
  Formula *processed;
  FormulaList **ipt;
  FormulaList *res;
  Formula *in_stack_00000390;
  FOOLElimination *in_stack_00000398;
  List<Kernel::Formula_*> **local_20;
  List<Kernel::Formula_*> *local_18;
  List<Kernel::Formula_*> *local_10;
  
  local_10 = in_RSI;
  local_18 = Lib::List<Kernel::Formula_*>::empty();
  local_20 = &local_18;
  while( true ) {
    bVar1 = Lib::List<Kernel::Formula_*>::isEmpty(local_10);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    Lib::List<Kernel::Formula_*>::head(local_10);
    head = process(in_stack_00000398,in_stack_00000390);
    this_00 = (List<Kernel::Formula_*> *)Lib::List<Kernel::Formula*>::operator_new(0xb93fa7);
    tail = Lib::List<Kernel::Formula_*>::empty();
    Lib::List<Kernel::Formula_*>::List(this_00,head,tail);
    *local_20 = this_00;
    local_20 = Lib::List<Kernel::Formula_*>::tailPtr(*local_20);
    local_10 = Lib::List<Kernel::Formula_*>::tail(local_10);
  }
  return local_18;
}

Assistant:

FormulaList* FOOLElimination::process(FormulaList* formulas) {
  FormulaList*  res = FormulaList::empty();
  FormulaList** ipt = &res;

  while (!FormulaList::isEmpty(formulas)) {
    Formula* processed = process(formulas->head());
    *ipt = new FormulaList(processed,FormulaList::empty());
    ipt = (*ipt)->tailPtr();
    formulas = formulas->tail();
  }

  return res;

  // return FormulaList::isEmpty(formulas) ? formulas : new FormulaList(process(formulas->head()), process(formulas->tail()));
}